

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cc
# Opt level: O3

Status __thiscall
google::protobuf::json_internal::anon_unknown_4::
WriteMap<google::protobuf::json_internal::UnparseProto3Type>
          (anon_unknown_4 *this,JsonWriter *writer,
          Msg<google::protobuf::json_internal::UnparseProto3Type> *msg,
          Field<google::protobuf::json_internal::UnparseProto3Type> field)

{
  int iVar1;
  ResolverPool *this_00;
  long lVar2;
  anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>_1
  aVar3;
  Field pFVar4;
  anon_union_8_1_1246618d_for_StatusOrData<bool>_1 aVar5;
  uintptr_t extraout_RAX;
  uintptr_t extraout_RAX_00;
  uintptr_t extraout_RAX_01;
  undefined8 uVar6;
  char *d;
  Desc *pDVar7;
  anon_union_8_1_1246618d_for_StatusOrData<bool>_1 *paVar8;
  size_t idx;
  StatusOr<long> x;
  StatusOr<const_google::protobuf::json_internal::UntypedMessage_*> entry;
  StatusOr<bool> is_empty;
  anon_union_8_1_1246618d_for_StatusOrData<long>_1 local_128;
  char *local_120;
  undefined8 uStack_118;
  anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>_1
  local_f8;
  Desc *local_f0;
  uint local_e4;
  anon_union_8_1_1246618d_for_StatusOrData<bool>_1 local_e0;
  char local_d8;
  _Tuple_impl<0UL,_unsigned_int> local_d0;
  _Tuple_impl<0UL,_int> local_cc;
  undefined1 local_c8 [40];
  size_t local_a0;
  Msg<google::protobuf::json_internal::UnparseProto3Type> *local_98;
  Desc *local_90;
  _Tuple_impl<0UL,_const_char_*> local_88;
  anon_union_8_2_a3c22f61_for_StatusOrData<unsigned_long>_3 local_80;
  anon_union_8_2_a3c22f61_for_StatusOrData<unsigned_long>_3 local_78;
  anon_union_8_2_a3c22f61_for_StatusOrData<unsigned_long>_3 local_70;
  undefined8 uStack_68;
  long local_60;
  char *local_58;
  char local_50 [32];
  
  io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"{",1);
  writer->indent_ = writer->indent_ + 1;
  local_98 = msg;
  local_90 = (Desc *)field;
  local_a0 = UntypedMessage::Count(msg,(field->raw_->field_0)._impl_.number_);
  if (local_a0 == 0) {
    writer->indent_ = writer->indent_ + -1;
  }
  else {
    local_c8._32_8_ = &writer->scratch_buf_;
    local_e4 = (uint)CONCAT71((int7)((ulong)local_c8._32_8_ >> 8),1);
    idx = 0;
    do {
      pDVar7 = local_90;
      UnparseProto3Type::GetMessage
                ((UnparseProto3Type *)&local_f8.status_,(Field)local_90,local_98,idx);
      d = (char *)local_f0;
      *(anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>_1
        *)this = local_f8;
      aVar3 = local_f8;
      if (((ulong)local_f8 & 1) == 0) {
        LOCK();
        *(int *)local_f8 = *(int *)local_f8 + 1;
        UNLOCK();
        aVar3.status_.rep_ = *(Status *)this;
      }
      if (aVar3 != (anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>_1
                    )0x1) goto LAB_002d062c;
      if (local_f8 !=
          (anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>_1
           )0x1) {
        absl::lts_20240722::internal_statusor::Helper::Crash(&local_f8.status_);
LAB_002d0652:
        paVar8 = &local_e0;
        goto LAB_002d065e;
      }
      this_00 = local_f0->pool_;
      pFVar4 = Proto3Type::ValueField((Proto3Type *)this_00,pDVar7);
      IsEmptyValue<google::protobuf::json_internal::UnparseProto3Type>
                ((anon_unknown_4 *)&local_e0.status_,
                 (Msg<google::protobuf::json_internal::UnparseProto3Type> *)d,pFVar4);
      *(anon_union_8_1_1246618d_for_StatusOrData<bool>_1 *)this = local_e0;
      aVar5 = local_e0;
      if (((ulong)local_e0 & 1) == 0) {
        LOCK();
        *(int *)local_e0 = *(int *)local_e0 + 1;
        UNLOCK();
        aVar5.status_.rep_ = *(Status *)this;
      }
      if (aVar5 != (anon_union_8_1_1246618d_for_StatusOrData<bool>_1)0x1) goto LAB_002d0622;
      if (local_e0 != (anon_union_8_1_1246618d_for_StatusOrData<bool>_1)0x1) goto LAB_002d0652;
      if (local_d8 == '\x01') {
        absl::lts_20240722::internal_statusor::StatusOrData<bool>::~StatusOrData
                  ((StatusOrData<bool> *)&local_e0.status_);
        absl::lts_20240722::internal_statusor::
        StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>::~StatusOrData
                  ((StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*> *)
                   &local_f8.status_);
        goto LAB_002d05db;
      }
      if ((local_e4 & 1) == 0) {
        d = ",";
        io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,",",1);
      }
      else {
        local_e4 = 0;
      }
      JsonWriter::NewLine(writer);
      pDVar7 = local_f0;
      if (local_f8 !=
          (anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>_1
           )0x1) goto LAB_002d0659;
      pFVar4 = Proto3Type::KeyField((Proto3Type *)this_00,(Desc *)d);
      iVar1 = (pFVar4->raw_->field_0)._impl_.kind_;
      switch(iVar1) {
      case 3:
      case 0x10:
      case 0x12:
        UnparseProto3Type::GetInt64((UnparseProto3Type *)&local_128.status_,pFVar4,(Msg *)pDVar7,0);
        *(anon_union_8_1_1246618d_for_StatusOrData<long>_1 *)this = local_128;
        if (((ulong)local_128 & 1) == 0) {
          LOCK();
          *(int *)local_128 = *(int *)local_128 + 1;
          UNLOCK();
        }
        if (local_128 != (anon_union_8_1_1246618d_for_StatusOrData<long>_1)0x1) {
          absl::lts_20240722::internal_statusor::StatusOrData<long>::~StatusOrData
                    ((StatusOrData<long> *)&local_128.status_);
          break;
        }
        local_78.data_ = (unsigned_long)local_120;
        JsonWriter::Write<long>(writer,(Quoted<long> *)&local_78);
        absl::lts_20240722::internal_statusor::StatusOrData<long>::~StatusOrData
                  ((StatusOrData<long> *)&local_128.status_);
LAB_002d04ab:
        *(undefined8 *)this = 1;
        goto LAB_002d0568;
      case 4:
      case 6:
        UnparseProto3Type::GetUInt64((UnparseProto3Type *)&local_128.status_,pFVar4,(Msg *)pDVar7,0)
        ;
        *(anon_union_8_1_1246618d_for_StatusOrData<long>_1 *)this = local_128;
        if (((ulong)local_128 & 1) == 0) {
          LOCK();
          *(int *)local_128 = *(int *)local_128 + 1;
          UNLOCK();
        }
        if (local_128 == (anon_union_8_1_1246618d_for_StatusOrData<long>_1)0x1) {
          local_80.data_ = (unsigned_long)local_120;
          JsonWriter::Write<unsigned_long>(writer,(Quoted<unsigned_long> *)&local_80);
          absl::lts_20240722::internal_statusor::StatusOrData<unsigned_long>::~StatusOrData
                    ((StatusOrData<unsigned_long> *)&local_128.status_);
          goto LAB_002d04ab;
        }
        absl::lts_20240722::internal_statusor::StatusOrData<unsigned_long>::~StatusOrData
                  ((StatusOrData<unsigned_long> *)&local_128.status_);
        break;
      case 5:
      case 0xf:
      case 0x11:
        UnparseProto3Type::GetInt32((UnparseProto3Type *)&local_128.status_,pFVar4,(Msg *)pDVar7,0);
        *(anon_union_8_1_1246618d_for_StatusOrData<long>_1 *)this = local_128;
        if (((ulong)local_128 & 1) == 0) {
          LOCK();
          *(int *)local_128 = *(int *)local_128 + 1;
          UNLOCK();
        }
        if (local_128 == (anon_union_8_1_1246618d_for_StatusOrData<long>_1)0x1) {
          local_cc.super__Head_base<0UL,_int,_false>._M_head_impl =
               (_Head_base<0UL,_int,_false>)(_Head_base<0UL,_int,_false>)local_120._0_4_;
          JsonWriter::Write<int>(writer,(Quoted<int> *)&local_cc);
LAB_002d0433:
          absl::lts_20240722::internal_statusor::StatusOrData<int>::~StatusOrData
                    ((StatusOrData<int> *)&local_128.status_);
          goto LAB_002d04ab;
        }
        goto LAB_002d043d;
      case 7:
      case 0xd:
        UnparseProto3Type::GetUInt32((UnparseProto3Type *)&local_128.status_,pFVar4,(Msg *)pDVar7,0)
        ;
        *(anon_union_8_1_1246618d_for_StatusOrData<long>_1 *)this = local_128;
        if (((ulong)local_128 & 1) == 0) {
          LOCK();
          *(int *)local_128 = *(int *)local_128 + 1;
          UNLOCK();
        }
        if (local_128 == (anon_union_8_1_1246618d_for_StatusOrData<long>_1)0x1) {
          local_d0.super__Head_base<0UL,_unsigned_int,_false>._M_head_impl =
               (_Head_base<0UL,_unsigned_int,_false>)
               (_Head_base<0UL,_unsigned_int,_false>)local_120._0_4_;
          JsonWriter::Write<unsigned_int>(writer,(Quoted<unsigned_int> *)&local_d0);
          absl::lts_20240722::internal_statusor::StatusOrData<unsigned_int>::~StatusOrData
                    ((StatusOrData<unsigned_int> *)&local_128.status_);
          goto LAB_002d04ab;
        }
        absl::lts_20240722::internal_statusor::StatusOrData<unsigned_int>::~StatusOrData
                  ((StatusOrData<unsigned_int> *)&local_128.status_);
        break;
      case 8:
        UnparseProto3Type::GetBool((UnparseProto3Type *)&local_128.status_,pFVar4,(Msg *)pDVar7,0);
        *(anon_union_8_1_1246618d_for_StatusOrData<long>_1 *)this = local_128;
        if (((ulong)local_128 & 1) == 0) {
          LOCK();
          *(int *)local_128 = *(int *)local_128 + 1;
          UNLOCK();
        }
        if (local_128 == (anon_union_8_1_1246618d_for_StatusOrData<long>_1)0x1) {
          local_88.super__Head_base<0UL,_const_char_*,_false>._M_head_impl =
               (_Head_base<0UL,_const_char_*,_false>)"false";
          if ((char)local_120 != '\0') {
            local_88.super__Head_base<0UL,_const_char_*,_false>._M_head_impl =
                 (_Head_base<0UL,_const_char_*,_false>)"true";
          }
          JsonWriter::Write<char_const*>(writer,(Quoted<const_char_*> *)&local_88);
          absl::lts_20240722::internal_statusor::StatusOrData<bool>::~StatusOrData
                    ((StatusOrData<bool> *)&local_128.status_);
          goto LAB_002d04ab;
        }
        absl::lts_20240722::internal_statusor::StatusOrData<bool>::~StatusOrData
                  ((StatusOrData<bool> *)&local_128.status_);
        break;
      case 9:
        UnparseProto3Type::GetString
                  ((StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                   &local_128.status_,pFVar4,(string *)local_c8._32_8_,(Msg *)pDVar7,0);
        *(anon_union_8_1_1246618d_for_StatusOrData<long>_1 *)this = local_128;
        if (((ulong)local_128 & 1) == 0) {
          LOCK();
          *(int *)local_128 = *(int *)local_128 + 1;
          UNLOCK();
        }
        if (local_128 == (anon_union_8_1_1246618d_for_StatusOrData<long>_1)0x1) {
          local_70.data_ = (unsigned_long)local_120;
          uStack_68 = uStack_118;
          JsonWriter::Write<std::basic_string_view<char,std::char_traits<char>>>
                    (writer,(Quoted<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                            &local_70);
          absl::lts_20240722::internal_statusor::
          StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>::~StatusOrData
                    ((StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                     &local_128.status_);
          goto LAB_002d04ab;
        }
        absl::lts_20240722::internal_statusor::
        StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>::~StatusOrData
                  ((StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                   &local_128.status_);
        break;
      default:
        local_128 = (anon_union_8_1_1246618d_for_StatusOrData<long>_1)0x1a;
        local_120 = "unsupported map key type: ";
        local_60 = absl::lts_20240722::numbers_internal::FastIntToBuffer(iVar1,local_50);
        local_58 = local_50;
        local_60 = local_60 - (long)local_58;
        absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_c8,(AlphaNum *)&local_128.status_);
        absl::lts_20240722::InvalidArgumentError(this,local_c8._8_8_,local_c8._0_8_);
        if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
          operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
        }
        break;
      case 0xe:
        UnparseProto3Type::GetEnumValue
                  ((UnparseProto3Type *)&local_128.status_,pFVar4,(Msg *)pDVar7,0);
        *(anon_union_8_1_1246618d_for_StatusOrData<long>_1 *)this = local_128;
        if (((ulong)local_128 & 1) == 0) {
          LOCK();
          *(int *)local_128 = *(int *)local_128 + 1;
          UNLOCK();
        }
        if (local_128 == (anon_union_8_1_1246618d_for_StatusOrData<long>_1)0x1) {
          WriteEnum<google::protobuf::json_internal::UnparseProto3Type>
                    (writer,pFVar4,local_120._0_4_,kQuoted);
          goto LAB_002d0433;
        }
LAB_002d043d:
        absl::lts_20240722::internal_statusor::StatusOrData<int>::~StatusOrData
                  ((StatusOrData<int> *)&local_128.status_);
      }
      if (*(long *)this != 1) {
LAB_002d0622:
        absl::lts_20240722::internal_statusor::StatusOrData<bool>::~StatusOrData
                  ((StatusOrData<bool> *)&local_e0.status_);
LAB_002d062c:
        absl::lts_20240722::internal_statusor::
        StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>::~StatusOrData
                  ((StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*> *)
                   &local_f8.status_);
        return (Status)extraout_RAX_01;
      }
LAB_002d0568:
      pDVar7 = (Desc *)0x3d99e0;
      io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,":",1);
      if ((writer->options_).add_whitespace == true) {
        pDVar7 = (Desc *)0x35eeae;
        io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_," ",1);
      }
      pFVar4 = Proto3Type::ValueField((Proto3Type *)this_00,pDVar7);
      if (local_f8 !=
          (anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>_1
           )0x1) {
LAB_002d0659:
        paVar8 = (anon_union_8_1_1246618d_for_StatusOrData<bool>_1 *)&local_f8;
LAB_002d065e:
        absl::lts_20240722::internal_statusor::Helper::Crash(&paVar8->status_);
        absl::lts_20240722::internal_statusor::Helper::Crash(&local_128.status_);
        absl::lts_20240722::internal_statusor::Helper::Crash(&local_128.status_);
        absl::lts_20240722::internal_statusor::Helper::Crash(&local_128.status_);
        absl::lts_20240722::internal_statusor::Helper::Crash(&local_128.status_);
        absl::lts_20240722::internal_statusor::Helper::Crash(&local_128.status_);
        absl::lts_20240722::internal_statusor::Helper::Crash(&local_128.status_);
        uVar6 = absl::lts_20240722::internal_statusor::Helper::Crash(&local_128.status_);
        absl::lts_20240722::internal_statusor::StatusOrData<bool>::~StatusOrData
                  ((StatusOrData<bool> *)&local_128.status_);
        absl::lts_20240722::internal_statusor::StatusOrData<bool>::~StatusOrData
                  ((StatusOrData<bool> *)&local_e0.status_);
        absl::lts_20240722::internal_statusor::
        StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>::~StatusOrData
                  ((StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*> *)
                   &local_f8.status_);
        _Unwind_Resume(uVar6);
      }
      (anonymous_namespace)::
      WriteSingular<google::protobuf::json_internal::UnparseProto3Type,google::protobuf::json_internal::UntypedMessage_const&>
                ((_anonymous_namespace_ *)this,writer,pFVar4,(UntypedMessage *)local_f0);
      lVar2 = *(long *)this;
      absl::lts_20240722::internal_statusor::StatusOrData<bool>::~StatusOrData
                ((StatusOrData<bool> *)&local_e0.status_);
      absl::lts_20240722::internal_statusor::
      StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>::~StatusOrData
                ((StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*> *)
                 &local_f8.status_);
      if (lVar2 != 1) {
        return (Status)extraout_RAX;
      }
LAB_002d05db:
      idx = idx + 1;
    } while (local_a0 != idx);
    writer->indent_ = writer->indent_ + -1;
    if ((local_e4 & 1) == 0) {
      JsonWriter::NewLine(writer);
    }
  }
  io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"}",1);
  *(undefined8 *)this = 1;
  return (Status)extraout_RAX_00;
}

Assistant:

absl::Status WriteMap(JsonWriter& writer, const Msg<Traits>& msg,
                      Field<Traits> field) {
  writer.Write("{");
  writer.Push();

  size_t count = Traits::GetSize(field, msg);
  bool first = true;
  for (size_t i = 0; i < count; ++i) {
    absl::StatusOr<const Msg<Traits>*> entry =
        Traits::GetMessage(field, msg, i);
    RETURN_IF_ERROR(entry.status());
    const Desc<Traits>& type = Traits::GetDesc(**entry);

    auto is_empty = IsEmptyValue<Traits>(**entry, Traits::ValueField(type));
    RETURN_IF_ERROR(is_empty.status());
    if (*is_empty) {
      // Empty google.protobuf.Values are silently discarded.
      continue;
    }

    writer.WriteComma(first);
    writer.NewLine();
    RETURN_IF_ERROR(
        WriteMapKey<Traits>(writer, **entry, Traits::KeyField(type)));
    writer.Write(":");
    writer.Whitespace(" ");
    RETURN_IF_ERROR(
        WriteSingular<Traits>(writer, Traits::ValueField(type), **entry));
  }

  writer.Pop();
  if (!first) {
    writer.NewLine();
  }
  writer.Write("}");
  return absl::OkStatus();
}